

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

Result * CoreML::Model::validate(Result *__return_storage_ptr__,Model *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32 uVar3;
  bool bVar4;
  Result result;
  Result local_60;
  string local_38;
  
  validateGeneric(&local_60,model);
  bVar4 = Result::good(&local_60);
  if (!bVar4) {
    paVar2 = &local_60.m_message.field_2;
    __return_storage_ptr__->m_type = local_60.m_type;
    __return_storage_ptr__->m_reason = local_60.m_reason;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.m_message._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_60.m_message.field_2._M_allocated_capacity._1_7_,
                    local_60.m_message.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
           local_60.m_message.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_60.m_message._M_dataplus._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_60.m_message.field_2._M_allocated_capacity._1_7_,
                    local_60.m_message.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_60.m_message._M_string_length;
    local_60.m_message._M_string_length = 0;
    local_60.m_message.field_2._M_local_buf[0] = '\0';
    local_60.m_message._M_dataplus._M_p = (pointer)paVar2;
    goto LAB_0027aa7f;
  }
  uVar3 = model->_oneof_case_[0];
  if (599 < (int)uVar3) {
    if (899 < (int)uVar3) {
      switch(uVar3) {
      case 2000:
        validate<(MLModelType)2000>(__return_storage_ptr__,model);
        break;
      case 0x7d1:
        validate<(MLModelType)2001>(__return_storage_ptr__,model);
        break;
      case 0x7d2:
        validate<(MLModelType)2002>(__return_storage_ptr__,model);
        break;
      case 0x7d3:
        validate<(MLModelType)2003>(__return_storage_ptr__,model);
        break;
      case 0x7d4:
        validate<(MLModelType)2004>(__return_storage_ptr__,model);
        break;
      case 0x7d5:
        validate<(MLModelType)2005>(__return_storage_ptr__,model);
        break;
      case 0x7d6:
        validate<(MLModelType)2006>(__return_storage_ptr__,model);
        break;
      default:
        if (uVar3 == 900) {
          validate<(MLModelType)900>(__return_storage_ptr__,model);
          break;
        }
        if (uVar3 == 3000) goto LAB_0027ab87;
        goto switchD_0027a9ed_default;
      }
      goto LAB_0027aa7f;
    }
    switch(uVar3) {
    case 600:
      validate<(MLModelType)600>(__return_storage_ptr__,model);
      break;
    case 0x259:
      validate<(MLModelType)601>(__return_storage_ptr__,model);
      break;
    case 0x25a:
      validate<(MLModelType)602>(__return_storage_ptr__,model);
      break;
    case 0x25b:
      validate<(MLModelType)603>(__return_storage_ptr__,model);
      break;
    case 0x25c:
      validate<(MLModelType)604>(__return_storage_ptr__,model);
      break;
    default:
      goto switchD_0027a9ed_default;
    case 0x25e:
      validate<(MLModelType)606>(__return_storage_ptr__,model);
      break;
    case 0x25f:
      validate<(MLModelType)607>(__return_storage_ptr__,model);
      break;
    case 0x261:
      validate<(MLModelType)609>(__return_storage_ptr__,model);
      break;
    case 0x262:
      validate<(MLModelType)610>(__return_storage_ptr__,model);
    }
    goto LAB_0027aa7f;
  }
  if ((int)uVar3 < 400) {
    if (299 < (int)uVar3) {
      switch(uVar3) {
      case 300:
        validate<(MLModelType)300>(__return_storage_ptr__,model);
        break;
      case 0x12d:
        validate<(MLModelType)301>(__return_storage_ptr__,model);
        break;
      case 0x12e:
        validate<(MLModelType)302>(__return_storage_ptr__,model);
        break;
      case 0x12f:
        validate<(MLModelType)303>(__return_storage_ptr__,model);
        break;
      case 0x130:
        validate<(MLModelType)304>(__return_storage_ptr__,model);
        break;
      default:
        goto switchD_0027a9ed_default;
      }
      goto LAB_0027aa7f;
    }
    if (uVar3 == 200) {
      validate<(MLModelType)200>(__return_storage_ptr__,model);
      goto LAB_0027aa7f;
    }
    if (uVar3 == 0xc9) {
      validate<(MLModelType)201>(__return_storage_ptr__,model);
      goto LAB_0027aa7f;
    }
    if (uVar3 == 0xca) {
      validate<(MLModelType)202>(__return_storage_ptr__,model);
      goto LAB_0027aa7f;
    }
  }
  else {
    if ((int)uVar3 < 500) {
      switch(uVar3) {
      case 400:
        validate<(MLModelType)400>(__return_storage_ptr__,model);
        break;
      case 0x191:
        validate<(MLModelType)401>(__return_storage_ptr__,model);
        break;
      case 0x192:
        validate<(MLModelType)402>(__return_storage_ptr__,model);
        break;
      case 0x193:
        validate<(MLModelType)403>(__return_storage_ptr__,model);
        break;
      case 0x194:
        validate<(MLModelType)404>(__return_storage_ptr__,model);
        break;
      default:
        goto switchD_0027a9ed_default;
      }
      goto LAB_0027aa7f;
    }
    if ((int)uVar3 < 0x1f6) {
      if (uVar3 == 500) {
        validate<(MLModelType)500>(__return_storage_ptr__,model);
        goto LAB_0027aa7f;
      }
      if (uVar3 == 0x1f5) {
        validate<(MLModelType)501>(__return_storage_ptr__,model);
        goto LAB_0027aa7f;
      }
    }
    else {
      if (uVar3 == 0x1f6) {
LAB_0027ab87:
        Result::Result(__return_storage_ptr__);
        goto LAB_0027aa7f;
      }
      if (uVar3 == 0x22b) {
        validate<(MLModelType)555>(__return_storage_ptr__,model);
        goto LAB_0027aa7f;
      }
      if (uVar3 == 0x22c) {
        validate<(MLModelType)556>(__return_storage_ptr__,model);
        goto LAB_0027aa7f;
      }
    }
  }
switchD_0027a9ed_default:
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Model did not specify a valid model-parameter type.","");
  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
LAB_0027aa7f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_message._M_dataplus._M_p != &local_60.m_message.field_2) {
    operator_delete(local_60.m_message._M_dataplus._M_p,
                    CONCAT71(local_60.m_message.field_2._M_allocated_capacity._1_7_,
                             local_60.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result Model::validate(const Specification::Model& model) {
        Result result = validateGeneric(model);
        if (!result.good()) { return result; }

        MLModelType type = static_cast<MLModelType>(model.Type_case());
        // TODO -- is there a better way to do this than switch/case?
        // the compiler doesn't like <type> being unknown at compile time.
        switch (type) {
                VALIDATE_MODEL_TYPE(pipelineClassifier);
                VALIDATE_MODEL_TYPE(pipelineRegressor);
                VALIDATE_MODEL_TYPE(pipeline);
                VALIDATE_MODEL_TYPE(glmClassifier);
                VALIDATE_MODEL_TYPE(glmRegressor);
                VALIDATE_MODEL_TYPE(treeEnsembleClassifier);
                VALIDATE_MODEL_TYPE(treeEnsembleRegressor);
                VALIDATE_MODEL_TYPE(supportVectorClassifier);
                VALIDATE_MODEL_TYPE(supportVectorRegressor);
                VALIDATE_MODEL_TYPE(neuralNetworkClassifier);
                VALIDATE_MODEL_TYPE(neuralNetworkRegressor);
                VALIDATE_MODEL_TYPE(neuralNetwork);
                VALIDATE_MODEL_TYPE(oneHotEncoder);
                VALIDATE_MODEL_TYPE(arrayFeatureExtractor);
                VALIDATE_MODEL_TYPE(featureVectorizer);
                VALIDATE_MODEL_TYPE(imputer);
                VALIDATE_MODEL_TYPE(dictVectorizer);
                VALIDATE_MODEL_TYPE(scaler);
                VALIDATE_MODEL_TYPE(nonMaximumSuppression);
                VALIDATE_MODEL_TYPE(categoricalMapping);
                VALIDATE_MODEL_TYPE(normalizer);
                VALIDATE_MODEL_TYPE(identity);
                VALIDATE_MODEL_TYPE(customModel);
                VALIDATE_MODEL_TYPE(bayesianProbitRegressor);
                VALIDATE_MODEL_TYPE(wordTagger);
                VALIDATE_MODEL_TYPE(textClassifier);
                VALIDATE_MODEL_TYPE(gazetteer);
                VALIDATE_MODEL_TYPE(wordEmbedding);
                VALIDATE_MODEL_TYPE(visionFeaturePrint);
                VALIDATE_MODEL_TYPE(kNearestNeighborsClassifier);
                VALIDATE_MODEL_TYPE(itemSimilarityRecommender);
                VALIDATE_MODEL_TYPE(soundAnalysisPreprocessing);
                VALIDATE_MODEL_TYPE(audioFeaturePrint);
                VALIDATE_MODEL_TYPE(linkedModel);
            case MLModelType_serializedModel:
            case MLModelType_mlProgram:
                return {};
            case MLModelType_NOT_SET:
            default:
                return Result(ResultType::INVALID_MODEL_INTERFACE, "Model did not specify a valid model-parameter type.");
        }
    }